

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O0

RealType __thiscall OpenMD::Thermo::getKinetic(Thermo *this)

{
  SnapshotManager *this_00;
  Snapshot *this_01;
  undefined8 *in_RDI;
  RealType RVar1;
  RealType RVar2;
  RealType RVar3;
  Thermo *in_stack_00000010;
  RealType ke;
  Snapshot *snap;
  Thermo *in_stack_00000060;
  Thermo *in_stack_000001f0;
  
  this_00 = SimInfo::getSnapshotManager((SimInfo *)*in_RDI);
  this_01 = SnapshotManager::getCurrentSnapshot(this_00);
  if ((this_01->hasKineticEnergy & 1U) == 0) {
    RVar1 = getTranslationalKinetic(in_stack_00000060);
    RVar2 = getRotationalKinetic(in_stack_000001f0);
    RVar3 = getElectronicKinetic(in_stack_00000010);
    Snapshot::setKineticEnergy(this_01,RVar1 + RVar2 + RVar3);
  }
  RVar1 = Snapshot::getKineticEnergy(this_01);
  return RVar1;
}

Assistant:

RealType Thermo::getKinetic() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasKineticEnergy) {
      RealType ke = getTranslationalKinetic() + getRotationalKinetic() +
                    getElectronicKinetic();

      snap->setKineticEnergy(ke);
    }
    return snap->getKineticEnergy();
  }